

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProcessing.cpp
# Opt level: O3

void mergeRelatedLines(vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_> *lines,
                      Mat *img)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  pointer pVVar9;
  int iVar10;
  int iVar11;
  pointer pVVar12;
  float fVar13;
  float fVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float p;
  int local_98;
  int local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  
  pVVar12 = (lines->super__Vector_base<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pVVar9 = (lines->super__Vector_base<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pVVar12 != pVVar9) {
    do {
      fVar1 = (pVVar12->super_Matx<float,_2,_1>).val[0];
      fVar14 = (pVVar12->super_Matx<float,_2,_1>).val[1];
      if ((((fVar1 != 0.0) || (NAN(fVar1))) || (fVar14 != -100.0)) || (NAN(fVar14))) {
        if ((fVar14 <= 0.7853982) || (2.3561945 <= fVar14)) {
          fVar13 = cosf(fVar14);
          local_68._0_4_ = (int)(fVar1 / fVar13);
          local_98 = **(int **)(img + 0x40);
          fVar13 = tanf(fVar14);
          fVar14 = cosf(fVar14);
          auVar17._4_4_ = fVar1;
          auVar17._0_4_ = (float)-local_98;
          auVar17._8_8_ = 0;
          auVar16._4_4_ = fVar14;
          auVar16._0_4_ = fVar13;
          auVar16._8_4_ = extraout_XMM0_Db_01;
          auVar16._12_4_ = extraout_XMM0_Db_02;
          auVar16 = divps(auVar17,auVar16);
          local_88 = (int)(auVar16._4_4_ + auVar16._0_4_);
          local_78 = ZEXT416(0);
        }
        else {
          fVar13 = sinf(fVar14);
          local_78._0_4_ = (int)(fVar1 / fVar13);
          local_88 = *(int *)(*(long *)(img + 0x40) + 4);
          fVar13 = tanf(fVar14);
          fVar14 = sinf(fVar14);
          auVar15._4_4_ = fVar1;
          auVar15._0_4_ = (float)-local_88;
          auVar15._8_8_ = 0;
          auVar2._4_4_ = fVar14;
          auVar2._0_4_ = fVar13;
          auVar2._8_4_ = extraout_XMM0_Db;
          auVar2._12_4_ = extraout_XMM0_Db_00;
          auVar16 = divps(auVar15,auVar2);
          local_98 = (int)(auVar16._4_4_ + auVar16._0_4_);
          local_68 = ZEXT416(0);
        }
        pVVar9 = (lines->super__Vector_base<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pVVar9 != (lines->
                      super__Vector_base<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>).
                      _M_impl.super__Vector_impl_data._M_finish) {
          do {
            bVar5 = true;
            lVar6 = 0;
            while( true ) {
              fVar1 = (pVVar12->super_Matx<float,_2,_1>).val[lVar6];
              fVar14 = (pVVar9->super_Matx<float,_2,_1>).val[lVar6];
              if (!bVar5) break;
              lVar6 = 1;
              bVar5 = false;
              if ((fVar1 != fVar14) || (NAN(fVar1) || NAN(fVar14))) break;
            }
            if (((fVar1 != fVar14) || (NAN(fVar1) || NAN(fVar14))) &&
               ((fVar1 = (pVVar9->super_Matx<float,_2,_1>).val[0],
                ABS(fVar1 - (pVVar12->super_Matx<float,_2,_1>).val[0]) < 20.0 &&
                (fVar14 = (pVVar9->super_Matx<float,_2,_1>).val[1],
                ABS(fVar14 - (pVVar12->super_Matx<float,_2,_1>).val[1]) < 0.17453292)))) {
              if ((fVar14 <= 0.7853982) || (2.3561945 <= fVar14)) {
                fVar13 = cosf(fVar14);
                iVar11 = (int)(fVar1 / fVar13);
                iVar7 = **(int **)(img + 0x40);
                fVar13 = tanf(fVar14);
                fVar14 = cosf(fVar14);
                auVar19._4_4_ = fVar1;
                auVar19._0_4_ = (float)-iVar7;
                auVar19._8_8_ = 0;
                auVar4._4_4_ = fVar14;
                auVar4._0_4_ = fVar13;
                auVar4._8_4_ = extraout_XMM0_Db_05;
                auVar4._12_4_ = extraout_XMM0_Db_06;
                auVar16 = divps(auVar19,auVar4);
                iVar8 = (int)(auVar16._4_4_ + auVar16._0_4_);
                iVar10 = 0;
              }
              else {
                fVar13 = sinf(fVar14);
                iVar10 = (int)(fVar1 / fVar13);
                iVar8 = *(int *)(*(long *)(img + 0x40) + 4);
                fVar13 = tanf(fVar14);
                fVar14 = sinf(fVar14);
                auVar18._4_4_ = fVar1;
                auVar18._0_4_ = (float)-iVar8;
                auVar18._8_8_ = 0;
                auVar3._4_4_ = fVar14;
                auVar3._0_4_ = fVar13;
                auVar3._8_4_ = extraout_XMM0_Db_03;
                auVar3._12_4_ = extraout_XMM0_Db_04;
                auVar16 = divps(auVar18,auVar3);
                iVar7 = (int)(auVar16._4_4_ + auVar16._0_4_);
                iVar11 = 0;
              }
              if (((double)(iVar11 - local_68._0_4_) * (double)(iVar11 - local_68._0_4_) +
                   (double)((iVar10 - local_78._0_4_) * (iVar10 - local_78._0_4_)) < 4096.0) &&
                 ((double)(iVar8 - local_88) * (double)(iVar8 - local_88) +
                  (double)((iVar7 - local_98) * (iVar7 - local_98)) < 4096.0)) {
                fVar1 = (pVVar12->super_Matx<float,_2,_1>).val[1];
                (pVVar12->super_Matx<float,_2,_1>).val[0] =
                     ((pVVar12->super_Matx<float,_2,_1>).val[0] +
                     (pVVar9->super_Matx<float,_2,_1>).val[0]) * 0.5;
                (pVVar12->super_Matx<float,_2,_1>).val[1] =
                     (fVar1 + (pVVar9->super_Matx<float,_2,_1>).val[1]) * 0.5;
                *(undefined8 *)(pVVar9->super_Matx<float,_2,_1>).val = 0xc2c8000000000000;
              }
            }
            pVVar9 = pVVar9 + 1;
          } while (pVVar9 != (lines->
                             super__Vector_base<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
        }
      }
      pVVar12 = pVVar12 + 1;
    } while (pVVar12 != pVVar9);
  }
  return;
}

Assistant:

void mergeRelatedLines(vector<Vec2f> *lines, Mat &img){
    vector<Vec2f>::iterator current;
    for(current=lines->begin();current!=lines->end();current++){
        if((*current)[0]==0 && (*current)[1]==-100) continue;
        float p1 = (*current)[0];
        float theta1 = (*current)[1];
        Point pt1current, pt2current;
        if(theta1>CV_PI*45/180 && theta1<CV_PI*135/180){
            pt1current.x=0;

            pt1current.y = p1/sin(theta1);

            pt2current.x=img.size().width;
            pt2current.y=-pt2current.x/tan(theta1) + p1/sin(theta1);
        }
        else{
            pt1current.y=0;

            pt1current.x=p1/cos(theta1);

            pt2current.y=img.size().height;
            pt2current.x=-pt2current.y/tan(theta1) + p1/cos(theta1);

        }
        vector<Vec2f>::iterator    pos;
        for(pos=lines->begin();pos!=lines->end();pos++){
            if(*current==*pos) continue;
            if(fabs((*pos)[0]-(*current)[0])<20 && fabs((*pos)[1]-(*current)[1])<CV_PI*10/180){
                float p = (*pos)[0];
                float theta = (*pos)[1];
                Point pt1, pt2;
                if((*pos)[1]>CV_PI*45/180 && (*pos)[1]<CV_PI*135/180){
                    pt1.x=0;
                    pt1.y = p/sin(theta);
                    pt2.x=img.size().width;
                    pt2.y=-pt2.x/tan(theta) + p/sin(theta);
                }
                else{
                    pt1.y=0;
                    pt1.x=p/cos(theta);
                    pt2.y=img.size().height;
                    pt2.x=-pt2.y/tan(theta) + p/cos(theta);
                }
                if(((double)(pt1.x-pt1current.x)*(pt1.x-pt1current.x) + (pt1.y-pt1current.y)*(pt1.y-pt1current.y)<64*64) &&
                    ((double)(pt2.x-pt2current.x)*(pt2.x-pt2current.x) + (pt2.y-pt2current.y)*(pt2.y-pt2current.y)<64*64))
                {
                    // Merge the two
                    (*current)[0] = ((*current)[0]+(*pos)[0])/2;

                    (*current)[1] = ((*current)[1]+(*pos)[1])/2;

                    (*pos)[0]=0;
                    (*pos)[1]=-100;
                }
            }
        }
    }
}